

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2.c
# Opt level: O2

void f_outer(uint64_t *h,uint8_t *blk,uint64_t offset_hi,uint64_t offset_lo,uint final)

{
  uint i;
  long lVar1;
  uint64_t m [16];
  uint64_t local_b8 [8];
  ulong local_78 [9];
  
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    m[lVar1] = *(uint64_t *)(blk + lVar1 * 8);
  }
  local_b8[6] = h[6];
  local_b8[7] = h[7];
  local_b8[4] = h[4];
  local_b8[5] = h[5];
  local_b8[2] = h[2];
  local_b8[3] = h[3];
  local_b8[0] = *h;
  local_b8[1] = h[1];
  local_78[7] = 0x5be0cd19137e2179;
  local_78[0] = 0x6a09e667f3bcc908;
  local_78[1] = 0xbb67ae8584caa73b;
  local_78[2] = 0x3c6ef372fe94f82b;
  local_78[3] = 0xa54ff53a5f1d36f1;
  local_78[4] = offset_lo ^ 0x510e527fade682d1;
  local_78[5] = offset_hi ^ 0x9b05688c2b3e6c1f;
  local_78[6] = -(ulong)final ^ 0x1f83d9abfb41bd6b;
  for (lVar1 = 0xf; lVar1 != 0xcf; lVar1 = lVar1 + 0x10) {
    g(local_b8,0,4,8,0xc,m[*(byte *)((long)iv + lVar1 + 0x31)],m[*(byte *)((long)iv + lVar1 + 0x32)]
     );
    g(local_b8,1,5,9,0xd,m[*(byte *)((long)iv + lVar1 + 0x33)],m[*(byte *)((long)iv + lVar1 + 0x34)]
     );
    g(local_b8,2,6,10,0xe,m[*(byte *)((long)iv + lVar1 + 0x35)],
      m[*(byte *)((long)iv + lVar1 + 0x36)]);
    g(local_b8,3,7,0xb,0xf,m[*(byte *)((long)iv + lVar1 + 0x37)],
      m[*(byte *)((long)iv + lVar1 + 0x38)]);
    g(local_b8,0,5,10,0xf,m[*(byte *)((long)iv + lVar1 + 0x39)],
      m[*(byte *)((long)iv + lVar1 + 0x3a)]);
    g(local_b8,1,6,0xb,0xc,m[*(byte *)((long)iv + lVar1 + 0x3b)],
      m[*(byte *)((long)iv + lVar1 + 0x3c)]);
    g(local_b8,2,7,8,0xd,m[*(byte *)((long)iv + lVar1 + 0x3d)],m[*(byte *)((long)iv + lVar1 + 0x3e)]
     );
    g(local_b8,3,4,9,0xe,m[*(byte *)((long)iv + lVar1 + 0x3f)],m[sigma[0][lVar1]]);
  }
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    h[lVar1] = h[lVar1] ^ local_78[lVar1] ^ local_b8[lVar1];
  }
  smemclr(local_b8,0x80);
  smemclr(m,0x80);
  return;
}

Assistant:

static inline void f_outer(uint64_t h[8], uint8_t blk[128], uint64_t offset_hi,
                           uint64_t offset_lo, unsigned final)
{
    uint64_t m[16];
    for (unsigned i = 0; i < 16; i++)
        m[i] = GET_64BIT_LSB_FIRST(blk + 8*i);
    f(h, m, offset_hi, offset_lo, final);
    smemclr(m, sizeof(m));
}